

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_statement.cpp
# Opt level: O1

string * __thiscall
duckdb::ExportStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,ExportStatement *this)

{
  pointer pcVar1;
  long *plVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *this_00;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_643533f + 9);
  local_98 = &__return_storage_ptr__->field_2;
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->database)._M_string_length != 0) {
    ::std::operator+(&local_50," ",&this->database);
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_50);
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar2 + 2);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar2 == in_RCX) {
      local_b8._16_8_ = (in_RCX->_M_dataplus)._M_p;
      local_b8._24_8_ = plVar2[3];
      local_b8._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 0x10);
    }
    else {
      local_b8._16_8_ = (in_RCX->_M_dataplus)._M_p;
      local_b8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar2;
    }
    local_b8._8_8_ = plVar2[1];
    *plVar2 = (long)in_RCX;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  this_00 = &this->info;
  pCVar3 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  pCVar4 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70," \'%s\'","");
  pcVar1 = (pCVar3->file_path)._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (pCVar3->file_path)._M_string_length);
  StringUtil::Format<std::__cxx11::string>
            ((string *)local_b8,(StringUtil *)local_70,&local_90,in_RCX);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  CopyInfo::CopyOptionsToString((string *)local_b8,&pCVar5->format,&pCVar4->options);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ExportStatement::ToString() const {
	string result = "";
	result += "EXPORT DATABASE";
	if (!database.empty()) {
		result += " " + database + " TO";
	}
	auto &path = info->file_path;
	D_ASSERT(info->is_from == false);
	auto &options = info->options;
	auto &format = info->format;
	result += StringUtil::Format(" '%s'", path);
	result += CopyInfo::CopyOptionsToString(format, options);
	result += ";";
	return result;
}